

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<int,int,int(*)(char_const**,int*)>
               (int num1,_func_int_char_ptr_ptr_int_ptr *read_f,bool is_ok)

{
  byte *pbVar1;
  byte bVar2;
  mp_type mVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 *puVar9;
  char (*pacVar10) [16];
  undefined1 *puVar11;
  long lVar12;
  float fVar13;
  char (*pacVar14) [16];
  code *pcVar15;
  double dVar16;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  byte *pbVar21;
  ulong uVar22;
  undefined8 *puVar23;
  undefined1 *puVar24;
  byte *pbVar25;
  ulong uVar26;
  undefined4 uVar27;
  byte *pbVar28;
  uint *puVar29;
  ulong uVar30;
  char *pcVar31;
  char *pcVar32;
  undefined8 *puVar33;
  char *pcVar34;
  byte *pbVar35;
  char *pcVar36;
  long lVar37;
  byte *pbVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1538;
  undefined1 *puStack_1530;
  char acStack_1528 [256];
  undefined1 uStack_1428;
  undefined8 uStack_1427;
  undefined1 auStack_141f [247];
  undefined8 *puStack_1328;
  byte *pbStack_1320;
  code *pcStack_1318;
  double dStack_1308;
  undefined8 *puStack_1300;
  char (*pacStack_12f8) [16];
  char acStack_12f0 [256];
  byte bStack_11f0;
  undefined1 auStack_11ef [2];
  undefined1 auStack_11ed [6];
  undefined8 uStack_11e7;
  undefined8 uStack_11df;
  long lStack_10e8;
  ulong uStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  code *pcStack_10c0;
  char (*pacStack_10b8) [16];
  char *pcStack_10b0;
  float fStack_10a8;
  undefined4 uStack_10a4;
  double dStack_10a0;
  double dStack_1098;
  char (*pacStack_1090) [16];
  char acStack_1088 [256];
  byte bStack_f88;
  undefined8 uStack_f87;
  char acStack_f7f [255];
  long lStack_e80;
  ulong uStack_e78;
  char *pcStack_e70;
  char *pcStack_e68;
  char *pcStack_e60;
  code *pcStack_e58;
  char (*pacStack_e50) [16];
  char *pcStack_e48;
  float fStack_e40;
  undefined4 uStack_e3c;
  double dStack_e38;
  double dStack_e30;
  code *pcStack_e28;
  byte bStack_e20;
  undefined8 uStack_e1f;
  char acStack_e17 [247];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  undefined8 *puStack_c18;
  ulong uStack_c10;
  undefined8 *puStack_c08;
  long lStack_c00;
  undefined1 *puStack_bf8;
  code *pcStack_bf0;
  code *pcStack_be8;
  float fStack_bdc;
  double dStack_bd8;
  double dStack_bd0;
  undefined8 *puStack_bc8;
  char (*pacStack_bc0) [16];
  byte bStack_bb8;
  undefined1 auStack_bb7 [2];
  undefined1 auStack_bb5 [6];
  undefined8 auStack_baf [30];
  char acStack_ab8 [256];
  undefined1 auStack_9b8 [8];
  char (*pacStack_9b0) [16];
  char *pcStack_9a8;
  char *pcStack_9a0;
  char *pcStack_998;
  char *pcStack_990;
  code *pcStack_988;
  float fStack_978;
  undefined4 uStack_974;
  char *pcStack_970;
  char *pcStack_968;
  double dStack_960;
  double dStack_958;
  char acStack_950 [9];
  char acStack_947 [247];
  char acStack_850 [256];
  undefined1 auStack_750 [8];
  ulong uStack_748;
  ulong uStack_740;
  char *pcStack_738;
  char (*pacStack_730) [16];
  undefined1 *puStack_728;
  code *pcStack_720;
  uint uStack_70c;
  ulong uStack_708;
  float fStack_6fc;
  double dStack_6f8;
  undefined1 *puStack_6f0;
  byte bStack_6e8;
  undefined8 uStack_6e7;
  undefined1 auStack_6df [247];
  char acStack_5e8 [256];
  undefined1 auStack_4e8 [8];
  byte *pbStack_4e0;
  char *pcStack_4d8;
  byte *pbStack_4d0;
  char (*pacStack_4c8) [16];
  byte *pbStack_4c0;
  code *pcStack_4b8;
  float fStack_4b0;
  int iStack_4ac;
  byte *pbStack_4a8;
  char (*pacStack_4a0) [16];
  double dStack_498;
  byte bStack_490;
  undefined8 uStack_48f;
  byte abStack_487 [247];
  char acStack_390 [256];
  undefined1 auStack_290 [8];
  undefined1 *puStack_288;
  char *pcStack_280;
  undefined1 *puStack_278;
  char *pcStack_270;
  long lStack_268;
  code *pcStack_260;
  int local_258;
  float local_254;
  char *local_250;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  undefined1 local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcVar34 = (char *)(long)num1;
  pcVar36 = (char *)(ulong)(uint)num1;
  if (num1 < 0) {
    pcVar17 = "%lld";
    pcVar32 = pcVar34;
  }
  else {
    pcVar17 = "%llu";
    pcVar32 = pcVar36;
  }
  pcStack_260 = (code *)0x12fa16;
  local_258 = num1;
  iVar5 = snprintf(local_138 + 0xe,0xf2,pcVar17,pcVar32);
  pcVar32 = local_138 + 0xe + iVar5;
  iVar6 = 0;
  pcStack_260 = (code *)0x12fa34;
  iVar5 = snprintf(pcVar32,(size_t)(local_38 + -(long)pcVar32)," into ");
  pcStack_260 = (code *)0x12fa53;
  snprintf(pcVar32 + iVar5,(size_t)(local_38 + -(long)(pcVar32 + iVar5)),"int%zu_t",0x20);
  pcStack_260 = (code *)0x12fa62;
  _space((FILE *)_stdout);
  pcStack_260 = (code *)0x12fa7b;
  fwrite("# ",2,1,_stdout);
  pcStack_260 = (code *)0x12fa8b;
  fputs(local_138,_stdout);
  pcStack_260 = (code *)0x12fa98;
  fputc(10,_stdout);
  if (-1 < local_258) {
    pcStack_260 = (code *)0x12faab;
    iVar6 = test_encode_uint_all_sizes((char (*) [16])&local_238,(uint64_t)pcVar36);
  }
  pacVar14 = (char (*) [16])(&local_238 + (long)iVar6 * 0x10);
  pcStack_260 = (code *)0x12facc;
  local_250 = pcVar34;
  iVar5 = test_encode_int_all_sizes(pacVar14,(int64_t)pcVar34);
  uVar20 = iVar6 + iVar5;
  puVar9 = (undefined1 *)(ulong)uVar20;
  if (uVar20 != 0 && SCARRY4(iVar6,iVar5) == (int)uVar20 < 0) {
    local_254 = (float)local_258;
    local_240 = (double)local_258;
    uVar30 = (ulong)uVar20;
    puVar24 = (undefined1 *)((long)&local_237 + 1);
    lVar37 = 0;
    do {
      lVar8 = lVar37 * 0x10;
      bVar2 = puVar24[-2];
      pcVar34 = (char *)(ulong)bVar2;
      mVar3 = mp_type_hint[(long)pcVar34];
      puVar11 = puVar24;
      if (mVar3 != MP_UINT) {
        if (mVar3 == MP_FLOAT) {
          if (bVar2 != 0xca) goto LAB_0012fe3c;
          uVar20 = *(uint *)(puVar24 + -1);
          fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                          uVar20 << 0x18);
          if ((fVar13 != local_254) || (NAN(fVar13) || NAN(local_254))) {
            pcStack_260 = (code *)0x12fe60;
            test_read_num<int,int,int(*)(char_const**,int*)>();
            goto LAB_0012fe60;
          }
          puVar11 = puVar24 + 3;
          goto LAB_0012fc78;
        }
        if (mVar3 == MP_INT) {
          pcVar34 = (char *)(long)(char)bVar2;
          iVar5 = bVar2 - 0xd0;
          puVar29 = &switchD_0012fb52::switchdataD_00139a8c;
          switch(iVar5) {
          case 0:
            pcVar34 = (char *)(long)(char)puVar24[-1];
            break;
          case 1:
            pcVar34 = (char *)(long)(short)(*(ushort *)(puVar24 + -1) << 8 |
                                           *(ushort *)(puVar24 + -1) >> 8);
            puVar11 = local_22f + lVar8 + -6;
            break;
          case 2:
            uVar20 = *(uint *)(puVar24 + -1);
            pcVar34 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                          (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
            puVar11 = local_22f + lVar8 + -4;
            break;
          case 3:
            uVar26 = *(ulong *)(puVar24 + -1);
            pcVar34 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                               (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
            puVar11 = local_22f + lVar8;
            break;
          default:
            if (bVar2 < 0xe0) {
              pcStack_260 = (code *)0x12fe28;
              test_read_num<int,int,int(*)(char_const**,int*)>();
              goto LAB_0012fe28;
            }
            puVar29 = (uint *)pacVar14;
            puVar11 = local_22f + lVar8 + -8;
          }
          if (pcVar34 == local_250) goto LAB_0012fc78;
          pcStack_260 = (code *)0x12fe84;
          test_read_num<int,int,int(*)(char_const**,int*)>();
          goto LAB_0012fe84;
        }
        if (bVar2 != 0xcb) {
LAB_0012fe60:
          pcStack_260 = (code *)0x12fe7f;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        uVar26 = *(ulong *)(puVar24 + -1);
        dVar16 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                          (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                          (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                          (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
        if ((dVar16 == local_240) && (!NAN(dVar16) && !NAN(local_240))) {
          puVar11 = local_22f + lVar8;
          goto LAB_0012fc78;
        }
        goto LAB_0012fe37;
      }
      iVar5 = bVar2 - 0xcc;
      puVar29 = &switchD_0012fbb0::switchdataD_00139a7c;
      switch(iVar5) {
      case 0:
        pcVar34 = (char *)(ulong)(byte)puVar24[-1];
        break;
      case 1:
        pcVar34 = (char *)(ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 |
                                         *(ushort *)(puVar24 + -1) >> 8);
        puVar11 = local_22f + lVar8 + -6;
        break;
      case 2:
        uVar20 = *(uint *)(puVar24 + -1);
        pcVar34 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                 | uVar20 << 0x18);
        puVar11 = local_22f + lVar8 + -4;
        break;
      case 3:
        uVar26 = *(ulong *)(puVar24 + -1);
        pcVar34 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                           (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                           (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                           (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
        puVar11 = local_22f + lVar8;
        break;
      default:
        if (-1 < (char)bVar2) {
          puVar29 = (uint *)pacVar14;
          puVar11 = local_22f + lVar8 + -8;
          break;
        }
LAB_0012fe28:
        pcStack_260 = (code *)0x12fe2d;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_0012fe2d;
      }
      if (pcVar34 != local_250) {
LAB_0012fe84:
        pcStack_260 = test_read_num<int,long,int(*)(char_const**,int*)>;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_390,"typed read of ",0xf);
        pcVar34 = "%lld";
        if (-1 < (long)puVar29) {
          pcVar34 = "%llu";
        }
        iVar6 = 0;
        pcStack_4b8 = (code *)0x12fef9;
        iStack_4ac = iVar5;
        puStack_288 = puVar9;
        pcStack_280 = pcVar32;
        puStack_278 = puVar11;
        pcStack_270 = pcVar36;
        lStack_268 = lVar37;
        pcStack_260 = (code *)puVar24;
        iVar5 = snprintf(acStack_390 + 0xe,0xf2,pcVar34,puVar29);
        pcVar34 = acStack_390 + (long)iVar5 + 0xe;
        pcStack_4b8 = (code *)0x12ff1d;
        iVar5 = snprintf(pcVar34,(size_t)(auStack_290 + -(long)pcVar34)," into ");
        pcStack_4b8 = (code *)0x12ff3c;
        snprintf(pcVar34 + iVar5,(size_t)(auStack_290 + -(long)(pcVar34 + iVar5)),"int%zu_t",0x20);
        pcStack_4b8 = (code *)0x12ff4b;
        _space((FILE *)_stdout);
        pcStack_4b8 = (code *)0x12ff64;
        fwrite("# ",2,1,_stdout);
        pcStack_4b8 = (code *)0x12ff74;
        fputs(acStack_390,_stdout);
        pcStack_4b8 = (code *)0x12ff81;
        fputc(10,_stdout);
        if (-1 < (long)puVar29) {
          pcStack_4b8 = (code *)0x12ff93;
          iVar6 = test_encode_uint_all_sizes((char (*) [16])&bStack_490,(uint64_t)puVar29);
        }
        pacVar14 = (char (*) [16])(&bStack_490 + (long)iVar6 * 0x10);
        pcStack_4b8 = (code *)0x12ffaf;
        iVar5 = test_encode_int_all_sizes(pacVar14,(int64_t)puVar29);
        uVar20 = iVar6 + iVar5;
        if (uVar20 == 0 || SCARRY4(iVar6,iVar5) != (int)uVar20 < 0) {
          return;
        }
        fStack_4b0 = (float)(long)puVar29;
        dStack_498 = (double)(long)puVar29;
        pbVar35 = (byte *)(ulong)uVar20;
        pbVar25 = (byte *)((long)&uStack_48f + 1);
        pbVar21 = (byte *)0x0;
        pacStack_4a0 = (char (*) [16])puVar29;
        goto LAB_0012ffde;
      }
LAB_0012fc78:
      local_248 = uVar30;
      switch(bVar2) {
      case 0xcc:
        pcVar32 = (char *)(ulong)(byte)puVar24[-1];
        goto LAB_0012fcb0;
      case 0xcd:
        puVar9 = local_22f + lVar8 + -6;
        pcVar32 = (char *)(ulong)(ushort)(*(ushort *)(puVar24 + -1) << 8 |
                                         *(ushort *)(puVar24 + -1) >> 8);
        break;
      case 0xce:
        uVar20 = *(uint *)(puVar24 + -1);
        pcVar32 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                 | uVar20 << 0x18);
        puVar9 = puVar24 + 3;
        goto LAB_0012fcce;
      case 0xcf:
        uVar30 = *(ulong *)(puVar24 + -1);
        pcVar32 = (char *)(uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                           (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                           (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                           (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
        puVar9 = local_22f + lVar8;
LAB_0012fcce:
        if (pcVar32 < (char *)0x80000000) break;
LAB_0012fe07:
        pcVar32 = (char *)0x0;
        iVar5 = 0;
        puVar9 = puVar24 + -2;
        goto LAB_0012fd2c;
      case 0xd0:
        pcVar32 = (char *)(ulong)(uint)(int)(char)puVar24[-1];
LAB_0012fcb0:
        puVar9 = local_22f + lVar8 + -7;
        break;
      case 0xd1:
        puVar9 = local_22f + lVar8 + -6;
        pcVar32 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(puVar24 + -1) << 8 |
                                                   *(ushort *)(puVar24 + -1) >> 8);
        break;
      case 0xd2:
        uVar20 = *(uint *)(puVar24 + -1);
        pcVar32 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                 | uVar20 << 0x18);
        puVar9 = local_22f + lVar8 + -4;
        break;
      case 0xd3:
        uVar30 = *(ulong *)(puVar24 + -1);
        uVar26 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                 (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8;
        pcVar32 = (char *)(uVar26 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                           (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
        if ((char *)(long)(int)uVar26 == pcVar32) {
          puVar9 = local_22f + lVar8;
          break;
        }
        goto LAB_0012fe07;
      default:
        if ((char)bVar2 < -0x20) goto LAB_0012fe07;
        iVar5 = 1;
        pcVar32 = (char *)(ulong)(uint)(int)(char)bVar2;
        puVar9 = local_22f + lVar8 + -8;
        goto LAB_0012fd2c;
      }
      iVar5 = 1;
LAB_0012fd2c:
      pcVar36 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      pcStack_260 = (code *)0x12fd50;
      _ok(iVar5,"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X");
      pcStack_260 = (code *)0x12fd76;
      _ok((uint)(puVar11 == puVar9),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      iVar5 = (int)pcVar32;
      if (local_258 < 0) {
        if (-1 < iVar5) goto LAB_0012fe32;
        pcVar34 = "(int64_t)num1 == (int64_t)num2";
        iVar6 = 0x746;
      }
      else {
        if (iVar5 < 0) {
LAB_0012fe2d:
          pcStack_260 = (code *)0x12fe32;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe32:
          pcStack_260 = (code *)0x12fe37;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe37:
          pcStack_260 = (code *)0x12fe3c;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe3c:
          pcStack_260 = (code *)0x12fe5b;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        pcVar34 = "(uint64_t)num1 == (uint64_t)num2";
        iVar6 = 0x743;
      }
      pacVar14 = (char (*) [16])(ulong)(iVar5 == local_258);
      pcStack_260 = (code *)0x12fdd8;
      _ok((uint)(iVar5 == local_258),pcVar34,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar6,"check int number");
      lVar37 = lVar37 + 1;
      puVar24 = puVar24 + 0x10;
      uVar30 = local_248 - 1;
    } while (uVar30 != 0);
  }
  return;
LAB_0012ffde:
  uVar20 = (uint)pacVar14;
  lVar37 = (long)pbVar21 * 0x10;
  pbVar38 = &bStack_490 + lVar37;
  bVar2 = pbVar25[-2];
  pacVar14 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar14];
  pbVar28 = pbVar25;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)pbVar25[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pbVar25 + -1) << 8 | *(ushort *)(pbVar25 + -1) >> 8);
      pbVar28 = abStack_487 + lVar37 + -6;
      break;
    case 0xce:
      uVar4 = *(uint *)(pbVar25 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                        uVar4 << 0x18);
      pbVar28 = abStack_487 + lVar37 + -4;
      break;
    case 0xcf:
      uVar30 = *(ulong *)(pbVar25 + -1);
      pacVar14 = (char (*) [16])
                 (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                  (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                  (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                  (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
      pbVar28 = abStack_487 + lVar37;
      break;
    default:
      if (-1 < (char)bVar2) {
        pbVar28 = abStack_487 + lVar37 + -8;
        break;
      }
LAB_00130380:
      pcStack_4b8 = (code *)0x130385;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00130385;
    }
    if (pacVar14 == (char (*) [16])puVar29) goto LAB_00130159;
LAB_001303d7:
    pcStack_4b8 = (code *)0x1303dc;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar28 = pbVar35;
    pcVar36 = (char *)puVar29;
    goto LAB_001303dc;
  }
  if (mVar3 != MP_FLOAT) {
    if (mVar3 != MP_INT) {
      if (bVar2 != 0xcb) goto LAB_0013038a;
      uVar30 = *(ulong *)(pbVar25 + -1);
      dVar16 = (double)(uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                        (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                        (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                        (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
      if ((dVar16 != dStack_498) || (NAN(dVar16) || NAN(dStack_498))) {
        pcStack_4b8 = (code *)0x1303ae;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_001303ae;
      }
      pbVar28 = abStack_487 + lVar37;
      goto LAB_00130159;
    }
    pacVar14 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)(char)pbVar25[-1];
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pbVar25 + -1) << 8 | *(ushort *)(pbVar25 + -1) >> 8);
      pbVar28 = abStack_487 + lVar37 + -6;
      break;
    case 0xd2:
      uVar4 = *(uint *)(pbVar25 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
      pbVar28 = abStack_487 + lVar37 + -4;
      break;
    case 0xd3:
      uVar30 = *(ulong *)(pbVar25 + -1);
      pacVar14 = (char (*) [16])
                 (uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                  (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                  (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                  (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
      pbVar28 = abStack_487 + lVar37;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_4b8 = (code *)0x130380;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_00130380;
      }
      pbVar28 = abStack_487 + lVar37 + -8;
    }
    if (pacVar14 == (char (*) [16])puVar29) goto LAB_00130159;
LAB_001303d2:
    pcStack_4b8 = (code *)0x1303d7;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d7;
  }
  if (bVar2 != 0xca) {
LAB_001303ae:
    pcStack_4b8 = (code *)0x1303cd;
    __assert_fail("c == 0xca",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x97e,"float mp_decode_float(const char **)");
  }
  uVar4 = *(uint *)(pbVar25 + -1);
  fVar13 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
  if ((fVar13 != fStack_4b0) || (NAN(fVar13) || NAN(fStack_4b0))) {
    pcStack_4b8 = (code *)0x1303d2;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d2;
  }
  pbVar28 = pbVar25 + 3;
LAB_00130159:
  pbVar1 = pbVar25 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar34 = (char *)(ulong)pbVar25[-1];
    goto LAB_0013018c;
  case 0xcd:
    pbVar38 = abStack_487 + lVar37 + -6;
    pcVar34 = (char *)(ulong)(ushort)(*(ushort *)(pbVar25 + -1) << 8 |
                                     *(ushort *)(pbVar25 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(pbVar25 + -1);
    pcVar34 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pbVar38 = pbVar25 + 3;
    goto LAB_001301aa;
  case 0xcf:
    uVar30 = *(ulong *)(pbVar25 + -1);
    pcVar34 = (char *)(uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                       (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                       (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                       (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
    pbVar38 = abStack_487 + lVar37;
LAB_001301aa:
    if (pcVar34 < (char *)0x80000000) break;
LAB_00130357:
    iVar6 = 1;
    pcVar34 = (char *)0x0;
    iVar5 = 0;
    pbVar38 = pbVar1;
    goto LAB_00130207;
  case 0xd0:
    pcVar34 = (char *)(ulong)(uint)(int)(char)pbVar25[-1];
LAB_0013018c:
    pbVar38 = abStack_487 + lVar37 + -7;
    break;
  case 0xd1:
    pbVar38 = abStack_487 + lVar37 + -6;
    pcVar34 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(pbVar25 + -1) << 8 |
                                               *(ushort *)(pbVar25 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(pbVar25 + -1);
    pcVar34 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pbVar38 = abStack_487 + lVar37 + -4;
    break;
  case 0xd3:
    uVar30 = *(ulong *)(pbVar25 + -1);
    uVar26 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
             (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8;
    pcVar34 = (char *)(uVar26 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                       (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
    if ((char *)(long)(int)uVar26 == pcVar34) {
      pbVar38 = abStack_487 + lVar37;
      break;
    }
    goto LAB_00130357;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130357;
    iVar5 = 1;
    iVar6 = 0;
    pcVar34 = (char *)(ulong)(uint)(int)(char)bVar2;
    pbVar38 = abStack_487 + lVar37 + -8;
    goto LAB_00130207;
  }
  iVar5 = 1;
  iVar6 = 0;
LAB_00130207:
  if ((char)iStack_4ac == '\0') {
    pcVar34 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4b8 = (code *)0x1302c4;
    _ok(iVar6,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar14 = (char (*) [16])(ulong)(pbVar1 == pbVar38);
    pcStack_4b8 = (code *)0x1302ea;
    _ok((uint)(pbVar1 == pbVar38),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar29 = (uint *)pacStack_4a0;
  }
  else {
    pcStack_4b8 = (code *)0x130243;
    pbStack_4a8 = pbVar21;
    _ok(iVar5,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar20 = (uint)(pbVar28 == pbVar38);
    pcStack_4b8 = (code *)0x130269;
    _ok((uint)(pbVar28 == pbVar38),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar29 = (uint *)pacStack_4a0;
    iVar5 = (int)pcVar34;
    if ((long)pacStack_4a0 < 0) {
      pbVar21 = pbVar35;
      pcVar36 = *pacStack_4a0;
      if (-1 < iVar5) {
LAB_001303dc:
        pcStack_4b8 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_5e8,"typed read of ",0xf);
        uStack_708 = (ulong)(int)uVar20;
        if ((int)uVar20 < 0) {
          pcVar32 = "%lld";
          uVar30 = uStack_708;
        }
        else {
          pcVar32 = "%llu";
          uVar30 = (ulong)uVar20;
        }
        pcStack_720 = (code *)0x130463;
        uStack_70c = uVar20;
        pbStack_4e0 = pbVar21;
        pcStack_4d8 = pcVar34;
        pbStack_4d0 = pbVar28;
        pacStack_4c8 = (char (*) [16])pcVar36;
        pbStack_4c0 = pbVar38;
        pcStack_4b8 = (code *)pbVar25;
        iVar5 = snprintf(acStack_5e8 + 0xe,0xf2,pcVar32,uVar30);
        pcVar34 = acStack_5e8 + 0xe + iVar5;
        iVar6 = 0;
        pcStack_720 = (code *)0x130481;
        iVar5 = snprintf(pcVar34,(size_t)(auStack_4e8 + -(long)pcVar34)," into ");
        pcStack_720 = (code *)0x1304a0;
        snprintf(pcVar34 + iVar5,(size_t)(auStack_4e8 + -(long)(pcVar34 + iVar5)),"int%zu_t",0x40);
        pcStack_720 = (code *)0x1304af;
        _space((FILE *)_stdout);
        pcStack_720 = (code *)0x1304c8;
        fwrite("# ",2,1,_stdout);
        pcStack_720 = (code *)0x1304d8;
        fputs(acStack_5e8,_stdout);
        pcStack_720 = (code *)0x1304e5;
        fputc(10,_stdout);
        if (-1 < (int)uStack_70c) {
          pcStack_720 = (code *)0x1304f9;
          iVar6 = test_encode_uint_all_sizes((char (*) [16])&bStack_6e8,(ulong)uVar20);
        }
        uVar30 = uStack_708;
        pcVar34 = (char *)(&bStack_6e8 + (long)iVar6 * 0x10);
        pcStack_720 = (code *)0x13051a;
        iVar5 = test_encode_int_all_sizes((char (*) [16])pcVar34,uStack_708);
        uVar20 = iVar6 + iVar5;
        if (uVar20 == 0 || SCARRY4(iVar6,iVar5) != (int)uVar20 < 0) {
          return;
        }
        fStack_6fc = (float)(int)uStack_70c;
        dStack_6f8 = (double)(int)uStack_70c;
        uVar26 = (ulong)uVar20;
        puVar9 = (undefined1 *)((long)&uStack_6e7 + 1);
        pcVar32 = (char *)0x0;
        goto LAB_00130547;
      }
      pacVar10 = (char (*) [16])(long)iVar5;
      pcVar36 = "(int64_t)num1 == (int64_t)num2";
      iVar5 = 0x746;
    }
    else {
      if (iVar5 < 0) {
LAB_00130385:
        pcStack_4b8 = (code *)0x13038a;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_0013038a:
        pcStack_4b8 = (code *)0x1303a9;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar10 = (char (*) [16])((ulong)pcVar34 & 0xffffffff);
      pcVar36 = "(uint64_t)num1 == (uint64_t)num2";
      iVar5 = 0x743;
    }
    pacVar14 = (char (*) [16])(ulong)(pacVar10 == pacStack_4a0);
    pcStack_4b8 = (code *)0x13032a;
    _ok((uint)(pacVar10 == pacStack_4a0),pcVar36,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar5,"check int number");
    pbVar21 = pbStack_4a8;
  }
  pbVar21 = pbVar21 + 1;
  pbVar25 = pbVar25 + 0x10;
  pbVar35 = pbVar35 + -1;
  if (pbVar35 == (byte *)0x0) {
    return;
  }
  goto LAB_0012ffde;
LAB_00130547:
  lVar37 = (long)pcVar32 * 0x10;
  bVar2 = puVar9[-2];
  uVar18 = (ulong)bVar2;
  uVar22 = (ulong)(char)bVar2;
  mVar3 = mp_type_hint[uVar18];
  puVar24 = puVar9;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00130873;
      uVar20 = *(uint *)(puVar9 + -1);
      fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar13 != fStack_6fc) || (NAN(fVar13) || NAN(fStack_6fc))) {
        pcStack_720 = (code *)0x130897;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00130897;
      }
      puVar24 = puVar9 + 3;
      goto LAB_001306c7;
    }
    if (mVar3 == MP_INT) {
      puVar29 = &switchD_0013059d::switchdataD_00139b0c;
      switch(bVar2) {
      case 0xd0:
        uVar18 = (ulong)(char)puVar9[-1];
        break;
      case 0xd1:
        uVar18 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
        puVar24 = auStack_6df + lVar37 + -6;
        break;
      case 0xd2:
        uVar20 = *(uint *)(puVar9 + -1);
        uVar18 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
        puVar24 = auStack_6df + lVar37 + -4;
        break;
      case 0xd3:
        uVar18 = *(ulong *)(puVar9 + -1);
        uVar18 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                 (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                 (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                 (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
        puVar24 = auStack_6df + lVar37;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_720 = (code *)0x13085f;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013085f;
        }
        uVar18 = uVar22;
        puVar24 = auStack_6df + lVar37 + -8;
        puVar29 = (uint *)pcVar34;
      }
      if (uVar18 == uVar30) goto LAB_001306c7;
      pcStack_720 = (code *)0x1308bb;
      test_read_num<long,int,int(*)(char_const**,long*)>();
      goto LAB_001308bb;
    }
    if (bVar2 != 0xcb) {
LAB_00130897:
      pcStack_720 = (code *)0x1308b6;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar30 = *(ulong *)(puVar9 + -1);
    dVar16 = (double)(uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                      (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                      (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                      (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
    if ((dVar16 == dStack_6f8) && (!NAN(dVar16) && !NAN(dStack_6f8))) {
      puVar24 = auStack_6df + lVar37;
      goto LAB_001306c7;
    }
    goto LAB_0013086e;
  }
  puVar29 = &switchD_001305fc::switchdataD_00139afc;
  switch(bVar2) {
  case 0xcc:
    uVar18 = (ulong)(byte)puVar9[-1];
    break;
  case 0xcd:
    uVar18 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    puVar24 = auStack_6df + lVar37 + -6;
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar9 + -1);
    uVar18 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    puVar24 = auStack_6df + lVar37 + -4;
    break;
  case 0xcf:
    uVar18 = *(ulong *)(puVar9 + -1);
    uVar18 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28 |
             uVar18 << 0x38;
    puVar24 = auStack_6df + lVar37;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar24 = auStack_6df + lVar37 + -8;
      puVar29 = (uint *)pcVar34;
      break;
    }
LAB_0013085f:
    pcStack_720 = (code *)0x130864;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00130864;
  }
  if (uVar18 != uVar30) {
LAB_001308bb:
    uVar27 = SUB84(puVar24,0);
    pcStack_720 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_850,"typed read of ",0xf);
    pcStack_988 = (code *)0x130920;
    uStack_974 = uVar27;
    uStack_748 = uVar22;
    uStack_740 = uVar30;
    pcStack_738 = pcVar32;
    pacStack_730 = (char (*) [16])pcVar36;
    puStack_728 = puVar9;
    pcStack_720 = (code *)uVar26;
    iVar5 = snprintf(acStack_850 + 0xe,0xf2,"%llu",puVar29);
    pcVar34 = acStack_850 + (long)iVar5 + 0xe;
    pcStack_988 = (code *)0x130944;
    iVar5 = snprintf(pcVar34,(size_t)(auStack_750 + -(long)pcVar34)," into ");
    pcStack_988 = (code *)0x130963;
    snprintf(pcVar34 + iVar5,(size_t)(auStack_750 + -(long)(pcVar34 + iVar5)),"int%zu_t",0x40);
    pcStack_988 = (code *)0x130972;
    _space((FILE *)_stdout);
    pcStack_988 = (code *)0x13098b;
    fwrite("# ",2,1,_stdout);
    pcStack_988 = (code *)0x13099b;
    fputs(acStack_850,_stdout);
    pcStack_988 = (code *)0x1309a8;
    fputc(10,_stdout);
    pcStack_988 = (code *)0x1309b5;
    pcVar34 = (char *)puVar29;
    uVar20 = test_encode_uint_all_sizes((char (*) [16])acStack_950,(uint64_t)puVar29);
    if (-1 < (long)puVar29) {
      pcVar34 = (char *)0x7fffffffffffffff;
      pcStack_988 = (code *)0x1309e0;
      iVar5 = test_encode_int_all_sizes
                        ((char (*) [16])(acStack_950 + (long)(int)uVar20 * 0x10),0x7fffffffffffffff)
      ;
      uVar20 = uVar20 + iVar5;
    }
    if ((int)uVar20 < 1) {
      return;
    }
    fStack_978 = (float)puVar29;
    auVar40._8_4_ = (int)((ulong)puVar29 >> 0x20);
    auVar40._0_8_ = puVar29;
    auVar40._12_4_ = 0x45300000;
    dStack_958 = auVar40._8_8_ - 1.9342813113834067e+25;
    dStack_960 = dStack_958 + ((double)CONCAT44(0x43300000,(int)puVar29) - 4503599627370496.0);
    uVar30 = (ulong)uVar20;
    pcVar36 = acStack_950 + 2;
    pcVar17 = (char *)0x0;
    pcStack_970 = (char *)puVar29;
    goto LAB_00130a52;
  }
LAB_001306c7:
  puVar11 = puVar9 + -2;
  puStack_6f0 = puVar24;
  switch(bVar2) {
  case 0xcc:
    uVar22 = (ulong)(byte)puVar9[-1];
    goto LAB_00130702;
  case 0xcd:
    puVar11 = auStack_6df + lVar37 + -6;
    uVar22 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(puVar9 + -1);
    uVar22 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    puVar11 = auStack_6df + lVar37 + -4;
    break;
  case 0xcf:
    uVar30 = *(ulong *)(puVar9 + -1);
    uVar22 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
             (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
             (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28 |
             uVar30 << 0x38;
    if (-1 < (long)uVar22) goto LAB_0013072c;
LAB_0013083f:
    uVar22 = 0;
    iVar5 = 0;
    goto LAB_0013077a;
  case 0xd0:
    uVar22 = (ulong)(char)puVar9[-1];
LAB_00130702:
    puVar11 = auStack_6df + lVar37 + -7;
    break;
  case 0xd1:
    puVar11 = auStack_6df + lVar37 + -6;
    uVar22 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xd2:
    uVar20 = *(uint *)(puVar9 + -1);
    puVar11 = auStack_6df + lVar37 + -4;
    uVar22 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                         uVar20 << 0x18);
    break;
  case 0xd3:
    uVar30 = *(ulong *)(puVar9 + -1);
    uVar22 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
             (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
             (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28 |
             uVar30 << 0x38;
LAB_0013072c:
    puVar11 = auStack_6df + lVar37;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0013083f;
    puVar11 = auStack_6df + lVar37 + -8;
  }
  iVar5 = 1;
LAB_0013077a:
  pcVar36 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_720 = (code *)0x13079e;
  _ok(iVar5,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
  pcStack_720 = (code *)0x1307c6;
  _ok((uint)(puStack_6f0 == puVar11),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar30 = uStack_708;
  if ((int)uStack_70c < 0) {
    if (-1 < (long)uVar22) goto LAB_00130869;
    pcVar17 = "(int64_t)num1 == (int64_t)num2";
    iVar5 = 0x746;
  }
  else {
    if ((long)uVar22 < 0) {
LAB_00130864:
      pcStack_720 = (code *)0x130869;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130869:
      pcStack_720 = (code *)0x13086e;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013086e:
      pcStack_720 = (code *)0x130873;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130873:
      pcStack_720 = (code *)0x130892;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar17 = "(uint64_t)num1 == (uint64_t)num2";
    iVar5 = 0x743;
  }
  pcVar34 = (char *)(ulong)(uVar22 == uStack_708);
  pcStack_720 = (code *)0x13082d;
  _ok((uint)(uVar22 == uStack_708),pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      "check int number");
  pcVar32 = pcVar32 + 1;
  puVar9 = puVar9 + 0x10;
  uVar26 = uVar26 - 1;
  if (uVar26 == 0) {
    return;
  }
  goto LAB_00130547;
LAB_00130a52:
  lVar37 = (long)pcVar17 * 0x10;
  bVar2 = pcVar36[-2];
  pcVar19 = (char *)(ulong)bVar2;
  pcVar31 = (char *)(long)(char)bVar2;
  mVar3 = mp_type_hint[(long)pcVar19];
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar19 = (char *)(ulong)(byte)pcVar36[-1];
      pcVar34 = pcVar36;
      break;
    case 0xcd:
      pcVar19 = (char *)(ulong)(ushort)(*(ushort *)(pcVar36 + -1) << 8 |
                                       *(ushort *)(pcVar36 + -1) >> 8);
      pcVar34 = acStack_950 + lVar37 + 3;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar36 + -1);
      pcVar19 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
      pcVar34 = acStack_947 + lVar37 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar36 + -1);
      pcVar19 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar34 = acStack_947 + lVar37;
      break;
    default:
      if (-1 < (char)bVar2) {
        pcVar34 = acStack_950 + lVar37 + 1;
        break;
      }
LAB_00130db7:
      pcStack_988 = (code *)0x130dbc;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130dbc;
    }
    if ((uint *)pcVar19 != puVar29) {
LAB_00130e0e:
      pcStack_988 = test_read_num<double,int,int(*)(char_const**,double*)>;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      pcStack_998 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      iVar5 = (int)puVar29;
      builtin_strncpy(acStack_ab8,"typed read of ",0xf);
      pcStack_be8 = (code *)(long)iVar5;
      if (iVar5 < 0) {
        pcVar19 = "%lld";
        pcVar15 = pcStack_be8;
      }
      else {
        pcVar19 = "%llu";
        pcVar15 = (code *)((ulong)puVar29 & 0xffffffff);
      }
      pcStack_bf0 = (code *)0x130e95;
      pacStack_bc0 = (char (*) [16])pcVar34;
      pacStack_9b0 = (char (*) [16])pcVar17;
      pcStack_9a8 = pcVar36;
      pcStack_9a0 = pcVar32;
      pcStack_990 = acStack_950 + lVar37;
      pcStack_988 = (code *)uVar30;
      iVar6 = snprintf(acStack_ab8 + 0xe,0xf2,pcVar19,pcVar15);
      pcVar34 = acStack_ab8 + 0xe + iVar6;
      iVar7 = 0;
      pcStack_bf0 = (code *)0x130eb4;
      iVar6 = snprintf(pcVar34,(size_t)(auStack_9b8 + -(long)pcVar34)," into ");
      puVar9 = auStack_9b8 + -(long)(pcVar34 + iVar6);
      pcStack_bf0 = (code *)0x130ece;
      snprintf(pcVar34 + iVar6,(size_t)puVar9,"double");
      pcStack_bf0 = (code *)0x130edd;
      _space((FILE *)_stdout);
      pcStack_bf0 = (code *)0x130ef6;
      fwrite("# ",2,1,_stdout);
      pcStack_bf0 = (code *)0x130f06;
      fputs(acStack_ab8,_stdout);
      pcStack_bf0 = (code *)0x130f13;
      fputc(10,_stdout);
      if (-1 < iVar5) {
        pcStack_bf0 = (code *)0x130f24;
        iVar7 = test_encode_uint_all_sizes
                          ((char (*) [16])&bStack_bb8,(uint64_t)((ulong)puVar29 & 0xffffffff));
      }
      pcVar36 = (char *)(&bStack_bb8 + (long)iVar7 * 0x10);
      pcStack_bf0 = (code *)0x130f42;
      pcVar34 = (char *)pcStack_be8;
      iVar6 = test_encode_int_all_sizes((char (*) [16])pcVar36,(int64_t)pcStack_be8);
      uVar20 = iVar7 + iVar6;
      if (uVar20 == 0 || SCARRY4(iVar7,iVar6) != (int)uVar20 < 0) {
        return;
      }
      fStack_bdc = (float)iVar5;
      dStack_bd8 = (double)iVar5;
      uVar30 = (ulong)uVar20;
      puVar33 = (undefined8 *)(auStack_bb7 + 1);
      pcVar32 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      lVar37 = 0;
      goto LAB_00130f73;
    }
  }
  else {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) {
LAB_00130de5:
        pcStack_988 = (code *)0x130e04;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar20 = *(uint *)(pcVar36 + -1);
      fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      if ((fVar13 == fStack_978) && (!NAN(fVar13) && !NAN(fStack_978))) {
        pcVar34 = pcVar36 + 3;
        goto LAB_00130bdc;
      }
      pcStack_988 = (code *)0x130e09;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
      pcStack_988 = (code *)0x130e0e;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130e0e;
    }
    if (mVar3 == MP_INT) {
      switch(bVar2) {
      case 0xd0:
        pcVar19 = (char *)(long)pcVar36[-1];
        pcVar34 = pcVar36;
        break;
      case 0xd1:
        pcVar19 = (char *)(long)(short)(*(ushort *)(pcVar36 + -1) << 8 |
                                       *(ushort *)(pcVar36 + -1) >> 8);
        pcVar34 = acStack_950 + lVar37 + 3;
        break;
      case 0xd2:
        uVar20 = *(uint *)(pcVar36 + -1);
        pcVar19 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                      (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
        pcVar34 = acStack_947 + lVar37 + -4;
        break;
      case 0xd3:
        uVar26 = *(ulong *)(pcVar36 + -1);
        pcVar19 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                           (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                           (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                           (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
        pcVar34 = acStack_947 + lVar37;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_988 = (code *)0x130db7;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130db7;
        }
        pcVar19 = pcVar31;
        pcVar34 = acStack_950 + lVar37 + 1;
      }
      if ((uint *)pcVar19 != puVar29) goto LAB_00130e09;
    }
    else {
      if (bVar2 != 0xcb) goto LAB_00130dc1;
      uVar26 = *(ulong *)(pcVar36 + -1);
      dVar16 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                        (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                        (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                        (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      if ((dVar16 != dStack_960) || (NAN(dVar16) || NAN(dStack_960))) {
        pcStack_988 = (code *)0x130de5;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_00130de5;
      }
      pcVar34 = acStack_947 + lVar37;
    }
  }
LAB_00130bdc:
  pcVar32 = pcVar36 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar31 = (char *)(ulong)(byte)pcVar36[-1];
    goto LAB_00130c11;
  case 0xcd:
    pcVar19 = acStack_950 + lVar37 + 3;
    pcVar31 = (char *)(ulong)(ushort)(*(ushort *)(pcVar36 + -1) << 8 |
                                     *(ushort *)(pcVar36 + -1) >> 8);
    break;
  case 0xce:
    uVar20 = *(uint *)(pcVar36 + -1);
    pcVar31 = (char *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                             uVar20 << 0x18);
    pcVar19 = acStack_947 + lVar37 + -4;
    break;
  case 0xcf:
    uVar26 = *(ulong *)(pcVar36 + -1);
    pcVar31 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if (-1 < (long)pcVar31) goto LAB_00130c3f;
LAB_00130d8e:
    pcVar31 = (char *)0x0;
    iVar6 = 1;
    iVar5 = 0;
    pcVar19 = pcVar32;
    goto LAB_00130c91;
  case 0xd0:
    pcVar31 = (char *)(long)pcVar36[-1];
LAB_00130c11:
    pcVar19 = acStack_950 + lVar37 + 2;
    break;
  case 0xd1:
    pcVar19 = acStack_950 + lVar37 + 3;
    pcVar31 = (char *)(long)(short)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8)
    ;
    break;
  case 0xd2:
    uVar20 = *(uint *)(pcVar36 + -1);
    pcVar19 = acStack_947 + lVar37 + -4;
    pcVar31 = (char *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8
                                 | uVar20 << 0x18);
    break;
  case 0xd3:
    uVar26 = *(ulong *)(pcVar36 + -1);
    pcVar31 = (char *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                       (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                       (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                       (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
LAB_00130c3f:
    pcVar19 = acStack_947 + lVar37;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130d8e;
    pcVar19 = acStack_950 + lVar37 + 1;
  }
  iVar5 = 1;
  iVar6 = 0;
LAB_00130c91:
  if ((char)uStack_974 == '\0') {
    pcStack_988 = (code *)0x130d51;
    _ok(iVar6,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar34 = "mp_num_pos2 == mp_nums[i]";
    pcStack_988 = (code *)0x130d77;
    _ok((uint)(pcVar32 == pcVar19),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar29 = (uint *)pcStack_970;
  }
  else {
    pcStack_988 = (code *)0x130ccd;
    pcStack_968 = pcVar36;
    _ok(iVar5,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcStack_988 = (code *)0x130cf3;
    _ok((uint)(pcVar34 == pcVar19),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar29 = (uint *)pcStack_970;
    if ((long)pcVar31 < 0) {
LAB_00130dbc:
      pcStack_988 = (code *)0x130dc1;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
      pcStack_988 = (code *)0x130de0;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pcVar34 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_988 = (code *)0x130d27;
    _ok((uint)(pcVar31 == pcStack_970),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar36 = pcStack_968;
    pcVar32 = pcVar17;
  }
  pcVar17 = pcVar17 + 1;
  pcVar36 = pcVar36 + 0x10;
  uVar30 = uVar30 - 1;
  if (uVar30 == 0) {
    return;
  }
  goto LAB_00130a52;
LAB_00130f73:
  lVar8 = lVar37 * 0x10;
  bVar2 = *(byte *)((long)puVar33 + -2);
  pcVar15 = (code *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar15];
  puVar23 = puVar33;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar15 = (code *)(ulong)*(byte *)((long)puVar33 + -1);
      break;
    case 0xcd:
      pcVar15 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar33 + -1) << 8 |
                                       *(ushort *)((long)puVar33 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_baf + lVar8 + -6);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar33 + -1);
      pcVar15 = (code *)(ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                               uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_baf + lVar8 + -4);
      break;
    case 0xcf:
      uVar26 = *(ulong *)((long)puVar33 + -1);
      pcVar15 = (code *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      puVar23 = auStack_baf + lVar37 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_001311cd:
        pcStack_bf0 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_bf0 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_bf0 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = auStack_baf + lVar37 * 2 + -1;
    }
    if (pcVar15 != pcStack_be8) {
      pcStack_bf0 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_bf0 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_bf0 = (code *)0x139f88;
      builtin_strncpy(acStack_d20,"typed read of ",0xf);
      pcStack_e58 = (code *)0x13128b;
      uStack_e3c = extraout_EDX;
      pcStack_e28 = (code *)pcVar34;
      puStack_c18 = puVar23;
      uStack_c10 = uVar30;
      puStack_c08 = puVar33;
      lStack_c00 = lVar37;
      puStack_bf8 = puVar9;
      iVar5 = snprintf(acStack_d20 + 0xe,0xf2,"%llu",pcVar36);
      pcVar34 = acStack_d20 + (long)iVar5 + 0xe;
      pcStack_e58 = (code *)0x1312af;
      iVar5 = snprintf(pcVar34,(size_t)(auStack_c20 + -(long)pcVar34)," into ");
      pcStack_e58 = (code *)0x1312c9;
      snprintf(pcVar34 + iVar5,(size_t)(auStack_c20 + -(long)(pcVar34 + iVar5)),"double");
      pcStack_e58 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_e58 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_e58 = (code *)0x131301;
      fputs(acStack_d20,_stdout);
      pcStack_e58 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_e58 = (code *)0x13131b;
      iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_e20,(uint64_t)pcVar36);
      pacVar14 = (char (*) [16])(&bStack_e20 + (long)iVar5 * 0x10);
      pcStack_e58 = (code *)0x131339;
      pacStack_e50 = (char (*) [16])pcVar36;
      iVar6 = test_encode_int_all_sizes(pacVar14,(int64_t)pcVar36);
      uVar20 = iVar5 + iVar6;
      if (uVar20 == 0 || SCARRY4(iVar5,iVar6) != (int)uVar20 < 0) {
        return;
      }
      fStack_e40 = (float)(long)pacStack_e50;
      dStack_e38 = (double)(long)pacStack_e50;
      uVar30 = (ulong)uVar20;
      pcVar17 = (char *)((long)&uStack_e1f + 1);
      lVar37 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_001311fb:
      pcStack_bf0 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)((long)puVar33 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_bdc) || (NAN(fVar13) || NAN(fStack_bdc))) goto LAB_001311d2;
    puVar23 = (undefined8 *)((long)puVar33 + 3);
  }
  else if (mVar3 == MP_INT) {
    pcVar15 = (code *)(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pcVar15 = (code *)(long)*(char *)((long)puVar33 + -1);
      pcVar34 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar15 = (code *)(long)(short)(*(ushort *)((long)puVar33 + -1) << 8 |
                                     *(ushort *)((long)puVar33 + -1) >> 8);
      puVar23 = (undefined8 *)((long)auStack_baf + lVar8 + -6);
      pcVar34 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar20 = *(uint *)((long)puVar33 + -1);
      pcVar15 = (code *)(long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                    (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
      puVar23 = (undefined8 *)((long)auStack_baf + lVar8 + -4);
      pcVar34 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar26 = *(ulong *)((long)puVar33 + -1);
      pcVar15 = (code *)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                         (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                         (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      puVar23 = auStack_baf + lVar37 * 2;
      pcVar34 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_bf0 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar23 = auStack_baf + lVar37 * 2 + -1;
    }
    if (pcVar15 != pcStack_be8) goto LAB_0013121f;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_001311d7;
    uVar26 = *(ulong *)((long)puVar33 + -1);
    dVar16 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar16 != dStack_bd8) || (NAN(dVar16) || NAN(dStack_bd8))) {
      pcStack_bf0 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar23 = auStack_baf + lVar37 * 2;
  }
  puStack_bc8 = (undefined8 *)((long)puVar33 + -2);
  puVar9 = (undefined1 *)(ulong)(uint)(int)(char)bVar2;
  dStack_bd0 = 0.0;
  pcStack_bf0 = (code *)0x131113;
  iVar5 = (*(code *)pacStack_bc0)(&puStack_bc8,&dStack_bd0);
  pcStack_bf0 = (code *)0x13113b;
  _ok((uint)(iVar5 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar9);
  pcStack_bf0 = (code *)0x131163;
  _ok((uint)(puVar23 == puStack_bc8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar39 = ABS(dStack_bd8 - dStack_bd0) < 1e-15;
  pcVar36 = (char *)(ulong)bVar39;
  pcVar34 = "double_eq(num1, num2)";
  pcStack_bf0 = (code *)0x1311a6;
  _ok((uint)bVar39,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar37 = lVar37 + 1;
  puVar33 = puVar33 + 2;
  uVar30 = uVar30 - 1;
  if (uVar30 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar8 = lVar37 * 0x10;
  bVar2 = pcVar17[-2];
  pacVar10 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar10];
  pcVar19 = pcVar17;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar17[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar19 = acStack_e17 + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar19 = acStack_e17 + lVar8 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar19 = acStack_e17 + lVar37 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131627:
        pcStack_e58 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_e58 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_e58 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar19 = acStack_e17 + (lVar37 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_e50) {
      pcStack_e58 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_e58 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1088,"typed read of ",0xf);
      pcStack_10c0 = (code *)0x1316e2;
      uStack_10a4 = extraout_EDX_00;
      pacStack_1090 = (char (*) [16])pcVar36;
      lStack_e80 = lVar37;
      uStack_e78 = uVar30;
      pcStack_e70 = pcVar34;
      pcStack_e68 = pcVar19;
      pcStack_e60 = pcVar17;
      pcStack_e58 = (code *)pcVar32;
      iVar5 = snprintf(acStack_1088 + 0xe,0xf2,"%lld",pacVar14);
      pcVar34 = acStack_1088 + (long)iVar5 + 0xe;
      pcStack_10c0 = (code *)0x131703;
      iVar5 = snprintf(pcVar34,(size_t)(&bStack_f88 + -(long)pcVar34)," into ");
      pcStack_10c0 = (code *)0x13171d;
      snprintf(pcVar34 + iVar5,(size_t)(&bStack_f88 + -(long)(pcVar34 + iVar5)),"double");
      pcStack_10c0 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_10c0 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x131752;
      fputs(acStack_1088,_stdout);
      pcStack_10c0 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_f88;
      pcStack_10c0 = (code *)0x131773;
      pacStack_10b8 = pacVar14;
      uVar20 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar14);
      if ((int)uVar20 < 1) {
        return;
      }
      fStack_10a8 = (float)(long)pacStack_10b8;
      dStack_10a0 = (double)(long)pacStack_10b8;
      uVar30 = (ulong)uVar20;
      pcVar36 = (char *)((long)&uStack_f87 + 1);
      lVar37 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131655:
      pcStack_e58 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar17 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_e40) || (NAN(fVar13) || NAN(fStack_e40))) goto LAB_0013162c;
    pcVar19 = pcVar17 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar17[-1];
      pcVar36 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar36 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_e17 + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar36 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_e17 + lVar8 + -4;
      break;
    case 0xd3:
      uVar26 = *(ulong *)(pcVar17 + -1);
      pacVar10 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar36 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_e17 + lVar37 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_e58 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar19 = acStack_e17 + (lVar37 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_e50) goto LAB_00131679;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131631;
    uVar26 = *(ulong *)(pcVar17 + -1);
    dVar16 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar16 != dStack_e38) || (NAN(dVar16) || NAN(dStack_e38))) {
      pcStack_e58 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar19 = acStack_e17 + lVar37 * 0x10;
  }
  pcVar32 = pcVar17 + -2;
  pcVar34 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_e30 = 0.0;
  pcStack_e58 = (code *)0x131508;
  pcStack_e48 = pcVar32;
  iVar5 = (*pcStack_e28)(&pcStack_e48,&dStack_e30);
  if ((char)uStack_e3c == '\0') {
    pcStack_e58 = (code *)0x1315d8;
    _ok((uint)(iVar5 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar34);
    bVar39 = pcVar32 == pcStack_e48;
    pcVar36 = "mp_num_pos2 == mp_nums[i]";
    iVar5 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar32 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e58 = (code *)0x131542;
    _ok((uint)(iVar5 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar34);
    pcStack_e58 = (code *)0x13156a;
    _ok((uint)(pcVar19 == pcStack_e48),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar39 = ABS(dStack_e38 - dStack_e30) < 1e-15;
    pcVar36 = "double_eq(num1, num2)";
    iVar5 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar14 = (char (*) [16])(ulong)bVar39;
  pcStack_e58 = (code *)0x131600;
  _ok((uint)bVar39,pcVar36,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      pcVar19);
  lVar37 = lVar37 + 1;
  pcVar17 = pcVar17 + 0x10;
  uVar30 = uVar30 - 1;
  if (uVar30 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar8 = lVar37 * 0x10;
  bVar2 = pcVar36[-2];
  pacVar14 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar14];
  pcVar17 = pcVar36;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar14 = (char (*) [16])(ulong)(byte)pcVar36[-1];
      break;
    case 0xcd:
      pacVar14 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
      pcVar17 = acStack_f7f + lVar8 + -6;
      break;
    case 0xce:
      uVar20 = *(uint *)(pcVar36 + -1);
      pacVar14 = (char (*) [16])
                 (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18);
      pcVar17 = acStack_f7f + lVar8 + -4;
      break;
    case 0xcf:
      uVar26 = *(ulong *)(pcVar36 + -1);
      pacVar14 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar17 = acStack_f7f + lVar37 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131a67:
        pcStack_10c0 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_10c0 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_10c0 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar17 = acStack_f7f + (lVar37 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_10b8) {
      pcStack_10c0 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_10c0 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12f0,"typed read of ",0xf);
      pcStack_1318 = (code *)0x131b1e;
      pacStack_12f8 = pacVar10;
      lStack_10e8 = lVar37;
      uStack_10e0 = uVar30;
      pcStack_10d8 = pcVar34;
      pcStack_10d0 = pcVar17;
      pcStack_10c8 = pcVar36;
      pcStack_10c0 = (code *)pcVar32;
      iVar5 = snprintf(acStack_12f0 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar34 = acStack_12f0 + (long)iVar5 + 0xe;
      pcStack_1318 = (code *)0x131b3f;
      iVar5 = snprintf(pcVar34,(size_t)(&bStack_11f0 + -(long)pcVar34)," into ");
      pbVar25 = &bStack_11f0 + -(long)(pcVar34 + iVar5);
      pcStack_1318 = (code *)0x131b59;
      snprintf(pcVar34 + iVar5,(size_t)pbVar25,"double");
      pcStack_1318 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar8 = 1;
      pcStack_1318 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_1318 = (code *)0x131b94;
      fputs(acStack_12f0,_stdout);
      pcVar15 = (code *)0xa;
      pcStack_1318 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar33 = (undefined8 *)(auStack_11ef + 1);
      bStack_11f0 = 0xca;
      _auStack_11ef = 0x1059c84a;
      uStack_11e7._7_1_ = 0xcb;
      uStack_11df = 0x220b5941;
      lVar37 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131a95:
      pcStack_10c0 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)(pcVar36 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != fStack_10a8) || (NAN(fVar13) || NAN(fStack_10a8))) goto LAB_00131a6c;
    pcVar17 = pcVar36 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar14 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar14 = (char (*) [16])(long)pcVar36[-1];
      break;
    case 0xd1:
      pacVar14 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
      pcVar17 = acStack_f7f + lVar8 + -6;
      break;
    case 0xd2:
      uVar20 = *(uint *)(pcVar36 + -1);
      pacVar14 = (char (*) [16])
                 (long)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                            uVar20 << 0x18);
      pcVar17 = acStack_f7f + lVar8 + -4;
      break;
    case 0xd3:
      uVar26 = *(ulong *)(pcVar36 + -1);
      pacVar14 = (char (*) [16])
                 (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                  (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                  (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                  (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
      pcVar17 = acStack_f7f + lVar37 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_10c0 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar17 = acStack_f7f + (lVar37 * 2 + -1) * 8;
    }
    if (pacVar14 != pacStack_10b8) goto LAB_00131ab9;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131a71;
    uVar26 = *(ulong *)(pcVar36 + -1);
    dVar16 = (double)(uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
                      (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
                      (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
                      (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38);
    if ((dVar16 != dStack_10a0) || (NAN(dVar16) || NAN(dStack_10a0))) {
      pcStack_10c0 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar17 = acStack_f7f + lVar37 * 0x10;
  }
  pcVar32 = pcVar36 + -2;
  pcVar34 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_1098 = 0.0;
  pcStack_10c0 = (code *)0x131948;
  pcStack_10b0 = pcVar32;
  iVar5 = (*(code *)pacStack_1090)(&pcStack_10b0,&dStack_1098);
  if ((char)uStack_10a4 == '\0') {
    pcStack_10c0 = (code *)0x131a18;
    _ok((uint)(iVar5 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar34);
    bVar39 = pcVar32 == pcStack_10b0;
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    iVar5 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar32 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_10c0 = (code *)0x131982;
    _ok((uint)(iVar5 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar34);
    pcStack_10c0 = (code *)0x1319aa;
    _ok((uint)(pcVar17 == pcStack_10b0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar39 = ABS(dStack_10a0 - dStack_1098) < 1e-15;
    pcVar17 = "double_eq(num1, num2)";
    iVar5 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar39;
  pcStack_10c0 = (code *)0x131a40;
  _ok((uint)bVar39,pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar5,
      pcVar19);
  lVar37 = lVar37 + 1;
  pcVar36 = pcVar36 + 0x10;
  uVar30 = uVar30 - 1;
  if (uVar30 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar12 = lVar37 * 0x10;
  bVar2 = *(byte *)((long)puVar33 + -2);
  uVar30 = (ulong)bVar2;
  mVar3 = mp_type_hint[uVar30];
  puVar23 = puVar33;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      uVar30 = (ulong)*(byte *)((long)puVar33 + -1);
      break;
    case 0xcd:
      uVar30 = (ulong)(ushort)(*(ushort *)((long)puVar33 + -1) << 8 |
                              *(ushort *)((long)puVar33 + -1) >> 8);
      puVar23 = (undefined8 *)(auStack_11ed + lVar12);
      break;
    case 0xce:
      uVar20 = *(uint *)((long)puVar33 + -1);
      uVar30 = (ulong)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18);
      puVar23 = (undefined8 *)(auStack_11ed + lVar12 + 2);
      break;
    case 0xcf:
      uVar30 = *(ulong *)((long)puVar33 + -1);
      uVar30 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
               (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
               (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28
               | uVar30 << 0x38;
      puVar23 = &uStack_11e7 + lVar37 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131e46:
        pcStack_1318 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_1318 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_1318 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar23 = (undefined8 *)(auStack_11ef + lVar12);
    }
    if (uVar30 != 0x642c88) {
      pcStack_1318 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_1318 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1528,"typed read of ",0xf);
      puStack_1328 = puVar23;
      pbStack_1320 = pbVar25;
      pcStack_1318 = (code *)lVar8;
      iVar5 = snprintf(acStack_1528 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar34 = acStack_1528 + (long)iVar5 + 0xe;
      iVar5 = snprintf(pcVar34,(size_t)(&uStack_1428 + -(long)pcVar34)," into ");
      snprintf(pcVar34 + iVar5,(size_t)(&uStack_1428 + -(long)(pcVar34 + iVar5)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1528,_stdout);
      fputc(10,_stdout);
      uStack_1428 = 0xcb;
      uStack_1427 = 0xb81e85eb513816c0;
      puStack_1530 = &uStack_1428;
      dStack_1538 = 0.0;
      iVar5 = (*pcVar15)(&puStack_1530,&dStack_1538);
      _ok((uint)(iVar5 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_141f == puStack_1530),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1538) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131e74:
      pcStack_1318 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar20 = *(uint *)((long)puVar33 + -1);
    fVar13 = (float)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                    uVar20 << 0x18);
    if ((fVar13 != 6.565e+06) || (NAN(fVar13))) goto LAB_00131e4b;
    puVar23 = (undefined8 *)((long)puVar33 + 3);
  }
  else if (mVar3 == MP_INT) {
    uVar30 = (ulong)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      uVar30 = (ulong)*(char *)((long)puVar33 + -1);
      break;
    case 0xd1:
      uVar30 = (ulong)(short)(*(ushort *)((long)puVar33 + -1) << 8 |
                             *(ushort *)((long)puVar33 + -1) >> 8);
      puVar23 = (undefined8 *)(auStack_11ed + lVar12);
      break;
    case 0xd2:
      uVar20 = *(uint *)((long)puVar33 + -1);
      uVar30 = (ulong)(int)(uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18);
      puVar23 = (undefined8 *)(auStack_11ed + lVar12 + 2);
      break;
    case 0xd3:
      uVar30 = *(ulong *)((long)puVar33 + -1);
      uVar30 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
               (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
               (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 | (uVar30 & 0xff00) << 0x28
               | uVar30 << 0x38;
      puVar23 = &uStack_11e7 + lVar37 * 2;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_1318 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar23 = (undefined8 *)(auStack_11ef + lVar12);
    }
    if (uVar30 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131e50;
    uVar30 = *(ulong *)((long)puVar33 + -1);
    dVar16 = (double)(uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                      (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8 |
                      (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                      (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
    if ((dVar16 != 6565000.0) || (NAN(dVar16))) {
      pcStack_1318 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar23 = &uStack_11e7 + lVar37 * 2;
  }
  puStack_1300 = (undefined8 *)((long)puVar33 + -2);
  pbVar25 = (byte *)(ulong)(uint)(int)(char)bVar2;
  dStack_1308 = 0.0;
  pcStack_1318 = (code *)0x131d8a;
  iVar5 = (*(code *)pacStack_12f8)(&puStack_1300,&dStack_1308);
  pcStack_1318 = (code *)0x131db2;
  _ok((uint)(iVar5 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",pbVar25);
  pcStack_1318 = (code *)0x131dda;
  _ok((uint)(puVar23 == puStack_1300),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar39 = ABS(6565000.0 - dStack_1308) < 1e-15;
  pcVar15 = (code *)(ulong)bVar39;
  pcStack_1318 = (code *)0x131e1f;
  _ok((uint)bVar39,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar37 = lVar37 + 1;
  puVar33 = puVar33 + 2;
  lVar8 = lVar8 + -1;
  if (lVar8 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}